

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

bool __thiscall
EthBasePort::CheckFirewirePacket
          (EthBasePort *this,uchar *packet,size_t length,nodeid_t node,uint tcode,uint tl)

{
  ostream *poVar1;
  
  if ((*(uint *)packet >> 4 & 0xf) == tcode) {
    if ((node == 0x3f) || ((*(ushort *)(packet + 6) & 0x3f) == node)) {
      if ((*(uint *)packet >> 10 & 0x3f) == tl) {
        if (tcode != 7) {
          return true;
        }
        if (*(ushort *)(packet + 0xe) == length) {
          return true;
        }
        poVar1 = (this->super_BasePort).outStr;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,"Inconsistent length: received = ",0x20);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", expected = ",0xd);
      }
      else {
        poVar1 = (this->super_BasePort).outStr;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,"Inconsistent Firewire TL: received = ",0x25);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", expected = ",0xd);
      }
    }
    else {
      poVar1 = (this->super_BasePort).outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Inconsistent source node: received = ",0x25);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", expected = ",0xd);
    }
  }
  else {
    poVar1 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Unexpected tcode: received = ",0x1d);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", expected = ",0xd);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return false;
}

Assistant:

bool EthBasePort::CheckFirewirePacket(const unsigned char *packet, size_t length, nodeid_t node, unsigned int tcode,
                                      unsigned int tl)
{
    if (!checkCRC(packet)) {
        outStr << "CheckFirewirePacket: CRC error" << std::endl;
        return false;
    }

    nodeid_t src_node;
    unsigned int tcode_recv;
    unsigned int tl_recv;
    GetFirewireHeaderInfo(packet, &src_node, &tcode_recv, &tl_recv);

    if (tcode_recv != tcode) {
        outStr << "Unexpected tcode: received = " << tcode_recv << ", expected = " << tcode << std::endl;
        return false;
    }
    if ((node != FW_NODE_BROADCAST) && (src_node != node)) {
        outStr << "Inconsistent source node: received = " << src_node << ", expected = " << node << std::endl;
        return false;
    }
    if (tl_recv != tl) {
        outStr << "Inconsistent Firewire TL: received = " << tl_recv
               << ", expected = " << tl << std::endl;
        return false;
    }
    // TODO: could also check QRESPONSE length
    if (tcode == BRESPONSE) {
        const quadlet_t *qpacket = reinterpret_cast<const quadlet_t *>(packet);
        size_t length_recv = (qpacket[3]&0xffff0000) >> 16;
        if (length_recv != length) {
            outStr << "Inconsistent length: received = " << length_recv << ", expected = " << length << std::endl;
            return false;
        }
    }
    return true;
}